

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

optional<toml::detail::multiline_spacer<toml::type_config>_> *
toml::detail::skip_multiline_spacer<toml::type_config>
          (optional<toml::detail::multiline_spacer<toml::type_config>_> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx,bool newline_found)

{
  element_type *peVar1;
  pointer puVar2;
  _Head_base<0UL,_toml::detail::scanner_base_*,_false> _Var3;
  long *plVar4;
  pointer pbVar5;
  pointer pbVar6;
  optional<toml::detail::multiline_spacer<toml::type_config>_> *poVar7;
  _Alloc_hider _Var8;
  bool bVar9;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last;
  scanner_storage *other;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  pointer pbVar12;
  bool bVar13;
  multiline_spacer<toml::type_config> spacer;
  region tabs;
  string comment;
  region sp;
  region comm;
  undefined1 local_240;
  undefined1 uStack_23f;
  undefined2 uStack_23e;
  undefined4 uStack_23c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  scanner_base local_220;
  repeat_at_least local_218;
  context<toml::type_config> *local_200;
  optional<toml::detail::multiline_spacer<toml::type_config>_> *local_1f8;
  scanner_base *local_1f0;
  scanner_base *local_1e8;
  character local_1e0;
  undefined1 local_1d0 [16];
  _Alloc_hider local_1c0;
  undefined4 local_1a0;
  undefined1 local_168 [16];
  element_type local_158 [3];
  undefined1 local_100 [16];
  _Alloc_hider local_f0;
  undefined4 local_d0;
  region local_98;
  
  uStack_23f = 2;
  uStack_23c = 0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar9 = false;
  local_220._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00539820;
  local_1e8 = (scanner_base *)&PTR__scanner_base_00539938;
  local_1f0 = (scanner_base *)&PTR__repeat_at_least_00539a98;
  local_240 = newline_found;
  local_200 = ctx;
  local_1f8 = __return_storage_ptr__;
  do {
    peVar1 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    last._M_current =
         (peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish +
         -(long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
    if (last._M_current <= (uchar *)loc->location_) break;
    syntax::comment((sequence *)local_100,&ctx->toml_spec_);
    local_1e0.super_scanner_base._vptr_scanner_base = local_220._vptr_scanner_base;
    local_1e0.value_ = '\n';
    local_218.super_scanner_base._vptr_scanner_base = (_func_int **)local_1e8;
    local_218.length_ = 0x439f29;
    local_218.other_.scanner_._M_t.
    super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
    ._M_t.
    super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
    .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
         (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
         (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
          )0x2;
    either::either<toml::detail::character,toml::detail::literal>
              ((either *)local_1d0,&local_1e0,(literal *)&local_218);
    sequence::sequence<toml::detail::sequence,toml::detail::either>
              ((sequence *)local_168,(sequence *)local_100,(either *)local_1d0);
    sequence::scan(&local_98,(sequence *)local_168,loc);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )(local_168 + 8));
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )(local_1d0 + 8));
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )(local_100 + 8));
    if (local_98.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) {
      local_218.super_scanner_base._vptr_scanner_base = local_220._vptr_scanner_base;
      local_218.length_ = CONCAT71(local_218.length_._1_7_,10);
      local_1d0._0_8_ = local_1e8;
      local_1d0._8_8_ = "\r\n";
      local_1c0._M_p = (pointer)0x2;
      either::either<toml::detail::character,toml::detail::literal>
                ((either *)local_100,(character *)&local_218,(literal *)local_1d0);
      _Var8._M_p = local_f0._M_p;
      for (p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_;
          p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var8._M_p;
          p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&p_Var10->_M_use_count) {
        _Var3._M_head_impl =
             (((unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                *)&p_Var10->_vptr__Sp_counted_base)->_M_t).
             super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
             ._M_t.
             super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
             .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
        (*(_Var3._M_head_impl)->_vptr_scanner_base[2])((region *)local_168,_Var3._M_head_impl,loc);
        if ((element_type *)local_168._0_8_ != (element_type *)0x0) {
          if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var8._M_p)
          goto LAB_003a4ba8;
          break;
        }
        region::~region((region *)local_168);
      }
      region::region((region *)local_168);
LAB_003a4ba8:
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
               *)(local_100 + 8));
      pbVar6 = local_238.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar5 = local_238.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((element_type *)local_168._0_8_ == (element_type *)0x0) {
        local_1d0._0_8_ = local_1f0;
        local_1d0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
        local_1c0._M_p = (pointer)operator_new(0x10);
        (((unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
           *)local_1c0._M_p)->_M_t).
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
             (scanner_base *)local_220._vptr_scanner_base;
        *(undefined1 *)
         &(((unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
             *)((long)local_1c0._M_p + 8))->_M_t).
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl = 0x20;
        repeat_at_least::scan((region *)local_100,(repeat_at_least *)local_1d0,loc);
        ctx = local_200;
        if ((pointer)local_1c0._M_p != (pointer)0x0) {
          (**(code **)((long)*(unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                               *)local_1c0._M_p + 8))();
        }
        if ((_func_int **)local_100._0_8_ == (_func_int **)0x0) {
          local_218.super_scanner_base._vptr_scanner_base = (_func_int **)local_1f0;
          local_218.length_ = 1;
          local_218.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
               (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                )operator_new(0x10);
          *(_func_int ***)
           local_218.other_.scanner_._M_t.
           super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
           ._M_t.
           super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
           .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
               local_220._vptr_scanner_base;
          *(undefined1 *)
           &((scanner_base *)
            ((long)local_218.other_.scanner_._M_t.
                   super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                   .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 8))->
            _vptr_scanner_base = 9;
          repeat_at_least::scan((region *)local_1d0,&local_218,loc);
          if (local_218.other_.scanner_._M_t.
              super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
              ._M_t.
              super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
              .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
              (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
               )0x0) {
            (*(*(_func_int ***)
                local_218.other_.scanner_._M_t.
                super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                ._M_t.
                super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
          }
          bVar13 = (_func_int **)local_1d0._0_8_ != (_func_int **)0x0;
          if (bVar13) {
            uStack_23f = 1;
            uStack_23c = local_1a0;
            bVar9 = true;
          }
          region::~region((region *)local_1d0);
        }
        else {
          uStack_23f = 0;
          uStack_23c = local_d0;
          bVar9 = true;
          bVar13 = true;
        }
        region::~region((region *)local_100);
      }
      else {
        local_240 = 1;
        if (local_238.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_238.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          paVar11 = &(local_238.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->field_2;
          do {
            plVar4 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (paVar11 + -1))->_M_dataplus)._M_p;
            if (paVar11 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar4) {
              operator_delete(plVar4,paVar11->_M_allocated_capacity + 1);
            }
            pbVar12 = (pointer)(paVar11 + 1);
            paVar11 = paVar11 + 2;
          } while (pbVar12 != pbVar6);
          local_238.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
        }
        uStack_23f = 2;
        uStack_23c = 0;
        bVar9 = true;
        bVar13 = true;
        ctx = local_200;
      }
      region::~region((region *)local_168);
    }
    else {
      local_240 = 1;
      puVar2 = ((local_98.source_.
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
               .super__Vector_impl_data._M_start;
      make_string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((string *)local_168,(detail *)(puVar2 + local_98.first_),
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(puVar2 + local_98.last_),last);
      if (((((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (((undefined1 *)
            ((long)&(((element_type *)(local_168._0_8_ + -0x18))->
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7))[local_168._8_8_] == '\n')) &&
          (CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168),
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) &&
         (((undefined1 *)
          ((long)&(((element_type *)(local_168._0_8_ + -0x18))->
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 7))[local_168._8_8_] == '\r')) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_238,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
      uStack_23f = 2;
      uStack_23c = 0;
      if ((element_type *)local_168._0_8_ != local_158) {
        operator_delete((void *)local_168._0_8_,
                        (ulong)(local_158[0].
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start + 1));
      }
      bVar9 = true;
      bVar13 = true;
    }
    region::~region(&local_98);
  } while (bVar13);
  poVar7 = local_1f8;
  if (bVar9) {
    *(ulong *)&(local_1f8->
               super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
               )._M_payload.
               super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
               .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
               _M_payload = CONCAT44(uStack_23c,CONCAT22(uStack_23e,CONCAT11(uStack_23f,local_240)))
    ;
    (local_1f8->
    super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>).
    _M_payload.
    super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>.
    super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>._M_payload.
    _M_value.comments.comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_238.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (local_1f8->
    super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>).
    _M_payload.
    super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>.
    super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>._M_payload.
    _M_value.comments.comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_238.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (local_1f8->
    super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>).
    _M_payload.
    super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>.
    super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>._M_payload.
    _M_value.comments.comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_238.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_238.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_238.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_238.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  (local_1f8->super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>)
  ._M_payload.
  super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>.
  super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>._M_engaged =
       bVar9;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_238);
  return poVar7;
}

Assistant:

cxx::optional<multiline_spacer<TC>>
skip_multiline_spacer(location& loc, context<TC>& ctx, const bool newline_found = false)
{
    const auto& spec = ctx.toml_spec();

    multiline_spacer<TC> spacer;
    spacer.newline_found = newline_found;
    spacer.indent_type   = indent_char::none;
    spacer.indent        = 0;
    spacer.comments.clear();

    bool spacer_found = false;
    while( ! loc.eof())
    {
        if(auto comm = sequence(syntax::comment(spec), syntax::newline(spec)).scan(loc))
        {
            spacer.newline_found = true;
            auto comment = comm.as_string();
            if( ! comment.empty() && comment.back() == '\n')
            {
                comment.pop_back();
                if (!comment.empty() && comment.back() == '\r')
                {
                    comment.pop_back();
                }
            }

            spacer.comments.push_back(std::move(comment));
            spacer.indent_type = indent_char::none;
            spacer.indent = 0;
            spacer_found = true;
        }
        else if(auto nl = syntax::newline(spec).scan(loc))
        {
            spacer.newline_found = true;
            spacer.comments.clear();
            spacer.indent_type = indent_char::none;
            spacer.indent = 0;
            spacer_found = true;
        }
        else if(auto sp = repeat_at_least(1, character(cxx::bit_cast<location::char_type>(' '))).scan(loc))
        {
            spacer.indent_type = indent_char::space;
            spacer.indent      = static_cast<std::int32_t>(sp.length());
            spacer_found = true;
        }
        else if(auto tabs = repeat_at_least(1, character(cxx::bit_cast<location::char_type>('\t'))).scan(loc))
        {
            spacer.indent_type = indent_char::tab;
            spacer.indent      = static_cast<std::int32_t>(tabs.length());
            spacer_found = true;
        }
        else
        {
            break; // done
        }
    }
    if( ! spacer_found)
    {
        return cxx::make_nullopt();
    }
    return spacer;
}